

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutApi.c
# Opt level: O2

void Cut_NodeSetTriv(Cut_Man_t *p,int Node)

{
  Cut_Cut_t *pCVar1;
  
  pCVar1 = Cut_NodeReadCutsNew(p,Node);
  if (pCVar1 == (Cut_Cut_t *)0x0) {
    pCVar1 = Cut_CutCreateTriv(p,Node);
    Cut_NodeWriteCutsNew(p,Node,pCVar1);
    return;
  }
  __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutApi.c"
                ,0x93,"void Cut_NodeSetTriv(Cut_Man_t *, int)");
}

Assistant:

void Cut_NodeSetTriv( Cut_Man_t * p, int Node )
{
    assert( Cut_NodeReadCutsNew(p, Node) == NULL );
    Cut_NodeWriteCutsNew( p, Node, Cut_CutCreateTriv(p, Node) );
}